

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::xml_document::save
          (xml_document *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding)

{
  xml_node_struct *pxVar1;
  ulong uVar2;
  uint uVar3;
  size_t size;
  bool bVar4;
  xml_buffered_writer buffered_writer;
  xml_buffered_writer local_2840;
  
  local_2840.bufsize = 0;
  local_2840.encoding = encoding;
  if ((encoding < encoding_latin1) && ((0x191U >> (encoding & 0x1f) & 1) != 0)) {
    local_2840.encoding = *(xml_encoding *)(&DAT_001293b4 + (ulong)encoding * 4);
  }
  bVar4 = (flags & 2) == 0;
  uVar2 = (ulong)(encoding == encoding_latin1 || bVar4);
  local_2840.writer = writer;
  if (encoding != encoding_latin1 && !bVar4) {
    uVar2 = 0xffffffbf;
    impl::anon_unknown_0::xml_buffered_writer::write
              (&local_2840,-0x11,(void *)0xffffffbb,0xffffffbf);
  }
  size = local_2840.bufsize;
  if ((flags & 8) == 0) {
    for (pxVar1 = ((this->super_xml_node)._root)->first_child; pxVar1 != (xml_node_struct *)0x0;
        pxVar1 = pxVar1->next_sibling) {
      uVar3 = (uint)pxVar1->header & 0xf;
      if (uVar3 == 7) {
        uVar2 = 1;
        bVar4 = false;
      }
      else if (uVar3 == 2) {
        bVar4 = false;
        uVar2 = 0;
      }
      else {
        bVar4 = true;
      }
      if (!bVar4) {
        if ((uVar2 & 1) != 0) goto LAB_0011aa3f;
        break;
      }
    }
    impl::anon_unknown_0::xml_buffered_writer::write_string(&local_2840,"<?xml version=\"1.0\"");
    if (encoding == encoding_latin1) {
      impl::anon_unknown_0::xml_buffered_writer::write_string
                (&local_2840," encoding=\"ISO-8859-1\"");
    }
    if (0x7fe < local_2840.bufsize) {
      impl::anon_unknown_0::xml_buffered_writer::flush
                (&local_2840,local_2840.buffer,local_2840.bufsize);
      local_2840.bufsize = 0;
    }
    (local_2840.buffer + local_2840.bufsize)[0] = '?';
    (local_2840.buffer + local_2840.bufsize)[1] = '>';
    size = local_2840.bufsize + 2;
    if ((flags & 4) == 0) {
      if (0x7fd < local_2840.bufsize) {
        local_2840.bufsize = size;
        impl::anon_unknown_0::xml_buffered_writer::flush(&local_2840,local_2840.buffer,size);
        size = 0;
      }
      local_2840.buffer[size] = '\n';
      size = size + 1;
    }
  }
LAB_0011aa3f:
  local_2840.bufsize = size;
  impl::anon_unknown_0::node_output(&local_2840,(this->super_xml_node)._root,indent,flags,0);
  impl::anon_unknown_0::xml_buffered_writer::flush(&local_2840,local_2840.buffer,local_2840.bufsize)
  ;
  return;
}

Assistant:

PUGI__FN void xml_document::save(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		impl::xml_buffered_writer buffered_writer(writer, encoding);

		if ((flags & format_write_bom) && encoding != encoding_latin1)
		{
			// BOM always represents the codepoint U+FEFF, so just write it in native encoding
		#ifdef PUGIXML_WCHAR_MODE
			unsigned int bom = 0xfeff;
			buffered_writer.write(static_cast<wchar_t>(bom));
		#else
			buffered_writer.write('\xef', '\xbb', '\xbf');
		#endif
		}

		if (!(flags & format_no_declaration) && !impl::has_declaration(_root))
		{
			buffered_writer.write_string(PUGIXML_TEXT("<?xml version=\"1.0\""));
			if (encoding == encoding_latin1) buffered_writer.write_string(PUGIXML_TEXT(" encoding=\"ISO-8859-1\""));
			buffered_writer.write('?', '>');
			if (!(flags & format_raw)) buffered_writer.write('\n');
		}

		impl::node_output(buffered_writer, _root, indent, flags, 0);

		buffered_writer.flush();
	}